

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O0

char * string_trim(char *string,string_edge_e which)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  size_t local_30;
  long sub_1;
  size_t sub;
  size_t len;
  string_edge_e which_local;
  char *string_local;
  
  sub = strlen(string);
  if (((which == STRING_START) || (which == STRING_BOTH)) &&
     (sVar1 = strspn(string," \t\n\r\f"), sVar1 != 0)) {
    memmove(string,string + sVar1,(sub + 1) - sVar1);
    sub = sub - sVar1;
  }
  if ((which == STRING_END) || (which == STRING_BOTH)) {
    local_30 = sub;
    sVar2 = local_30;
    do {
      local_30 = sVar2;
      sVar2 = local_30 - 1;
      if ((long)sVar2 < 0) break;
      pcVar3 = strchr(" \t\n\r\f",(int)string[sVar2]);
    } while (pcVar3 != (char *)0x0);
    if (sVar2 == 0xffffffffffffffff) {
      *string = '\0';
    }
    else {
      string[local_30] = '\0';
    }
  }
  return string;
}

Assistant:

char *
string_trim(char *string, enum string_edge_e which)
{
    size_t len;

    len = strlen(string);
    if (which == STRING_START || which == STRING_BOTH) {
        size_t sub = strspn(string, " \t\n\r\f");
        if (sub > 0) {
            memmove(string, string + sub, len + 1 - sub);
            len -= sub;
        }
    }
    if (which == STRING_END || which == STRING_BOTH) {
        long sub = len;
        while (--sub >= 0)
            if (strchr(" \t\n\r\f", string[sub]) == NULL)
                break;
        if (sub == -1)
            string[0] = '\0';
        else
            string[sub+1] = '\0';
    }
    return string;
}